

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_splitter.cc
# Opt level: O3

void brotli::RefineEntropyCodes<brotli::Histogram<256>,unsigned_char>
               (uchar *data,size_t length,size_t stride,
               vector<brotli::Histogram<256>,_std::allocator<brotli::Histogram<256>_>_> *vec)

{
  uint32_t *puVar1;
  uint32_t *puVar2;
  pointer pHVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  size_t sVar11;
  size_t sVar12;
  long lVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  size_t sVar18;
  bool bVar19;
  int local_440 [260];
  
  pHVar3 = (vec->
           super__Vector_base<brotli::Histogram<256>,_std::allocator<brotli::Histogram<256>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  uVar4 = ((long)(vec->
                 super__Vector_base<brotli::Histogram<256>,_std::allocator<brotli::Histogram<256>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pHVar3) / 0x410;
  uVar17 = (length * 2) / stride + uVar4 + 99;
  if (uVar17 != uVar17 % uVar4) {
    sVar18 = length;
    if (stride < length) {
      sVar18 = stride;
    }
    uVar15 = 7;
    uVar16 = 0;
    do {
      memset(local_440,0,0x408);
      if (stride < length) {
        bVar19 = uVar15 == 0;
        uVar15 = uVar15 * 0x41a7;
        if (bVar19) {
          uVar15 = 1;
        }
        uVar14 = (ulong)uVar15 % (1 - (stride - length));
        sVar12 = stride;
      }
      else {
        uVar14 = 0;
        sVar12 = length;
      }
      if (sVar12 != 0) {
        sVar11 = 0;
        do {
          local_440[data[sVar11 + uVar14]] = local_440[data[sVar11 + uVar14]] + 1;
          sVar11 = sVar11 + 1;
        } while (sVar18 != sVar11);
      }
      uVar14 = uVar16 % uVar4;
      pHVar3[uVar14].total_count_ = pHVar3[uVar14].total_count_ + sVar12;
      lVar13 = 0;
      do {
        iVar5 = local_440[lVar13 + 1];
        iVar6 = local_440[lVar13 + 2];
        iVar7 = local_440[lVar13 + 3];
        puVar1 = pHVar3[uVar14].data_ + lVar13;
        uVar8 = puVar1[1];
        uVar9 = puVar1[2];
        uVar10 = puVar1[3];
        puVar2 = pHVar3[uVar14].data_ + lVar13;
        *puVar2 = *puVar1 + local_440[lVar13];
        puVar2[1] = uVar8 + iVar5;
        puVar2[2] = uVar9 + iVar6;
        puVar2[3] = uVar10 + iVar7;
        lVar13 = lVar13 + 4;
      } while (lVar13 != 0x100);
      uVar16 = uVar16 + 1;
    } while (uVar16 < uVar17 - uVar17 % uVar4);
  }
  return;
}

Assistant:

void RefineEntropyCodes(const DataType* data, size_t length,
                        size_t stride,
                        std::vector<HistogramType>* vec) {
  size_t iters =
      kIterMulForRefining * length / stride + kMinItersForRefining;
  unsigned int seed = 7;
  iters = ((iters + vec->size() - 1) / vec->size()) * vec->size();
  for (size_t iter = 0; iter < iters; ++iter) {
    HistogramType sample;
    RandomSample(&seed, data, length, stride, &sample);
    size_t ix = iter % vec->size();
    (*vec)[ix].AddHistogram(sample);
  }
}